

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O1

int __thiscall particleSamples::read_in_particle_samples_mixed_event_binary(particleSamples *this)

{
  ifstream *piVar1;
  uint uVar2;
  vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
  *this_00;
  iterator __position;
  vector<particle_info,std::allocator<particle_info>> *this_01;
  undefined4 uVar3;
  int iVar4;
  anon_struct_120_15_f999644b *paVar5;
  iterator __position_00;
  int i;
  ulong uVar6;
  long lVar7;
  byte bVar8;
  int n_particle;
  int pdg;
  float array [9];
  float temp;
  int local_ec;
  undefined4 local_e8;
  uint local_e4;
  ulong local_e0;
  float local_d8 [12];
  vector<particle_info,_std::allocator<particle_info>_> *local_a8;
  double local_a0;
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  
  bVar8 = 0;
  clear_out_previous_record(this,this->full_particle_list_mixed_event);
  piVar1 = &this->inputfile_mixed_event;
  uVar6 = 0;
  do {
    if (this->event_buffer_size <= (int)uVar6) {
      return 0;
    }
    local_ec = 0;
    std::istream::read((char *)piVar1,(long)&local_ec);
    uVar2 = *(uint *)(&this->field_0x3f0 + *(long *)(*(long *)&this->inputfile_mixed_event + -0x18))
    ;
    if ((uVar2 & 2) == 0) {
      this_00 = (vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
                 *)this->full_particle_list_mixed_event;
      local_e4 = uVar2;
      local_e0 = uVar6;
      local_a8 = (vector<particle_info,_std::allocator<particle_info>_> *)operator_new(0x18);
      (local_a8->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_a8->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_a8->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __position._M_current =
           *(vector<particle_info,_std::allocator<particle_info>_> ***)(this_00 + 8);
      if (__position._M_current ==
          *(vector<particle_info,_std::allocator<particle_info>_> ***)(this_00 + 0x10)) {
        std::
        vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
        ::_M_realloc_insert<std::vector<particle_info,std::allocator<particle_info>>*>
                  (this_00,__position,&local_a8);
      }
      else {
        *__position._M_current = local_a8;
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
      }
      if (0 < local_ec) {
        iVar4 = 0;
        do {
          local_e8 = 0;
          std::istream::read((char *)piVar1,(long)&local_e8);
          lVar7 = 0;
          do {
            local_a8 = (vector<particle_info,_std::allocator<particle_info>_> *)
                       ((ulong)local_a8 & 0xffffffff00000000);
            std::istream::read((char *)piVar1,(long)&local_a8);
            local_d8[lVar7] = local_a8._0_4_;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 9);
          local_a8 = (vector<particle_info,_std::allocator<particle_info>_> *)
                     CONCAT44(local_a8._4_4_,local_e8);
          local_a0 = (double)local_d8[0];
          local_70._8_4_ = SUB84((double)SUB84(local_d8._8_8_,4),0);
          local_70._0_8_ = (double)(float)local_d8._8_8_;
          local_70._12_4_ = (int)((ulong)(double)SUB84(local_d8._8_8_,4) >> 0x20);
          local_60._8_4_ = SUB84((double)local_d8[1],0);
          local_60._0_8_ = (double)local_d8[4];
          local_60._12_4_ = (int)((ulong)(double)local_d8[1] >> 0x20);
          local_90._8_4_ = SUB84((double)SUB84(local_d8._24_8_,4),0);
          local_90._0_8_ = (double)(float)local_d8._24_8_;
          local_90._12_4_ = (int)((ulong)(double)SUB84(local_d8._24_8_,4) >> 0x20);
          local_80._8_4_ = SUB84((double)local_d8[5],0);
          local_80._0_8_ = (double)local_d8[8];
          local_80._12_4_ = (int)((ulong)(double)local_d8[5] >> 0x20);
          this_01 = (vector<particle_info,std::allocator<particle_info>> *)
                    *(this->full_particle_list_mixed_event->
                     super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                     )._M_impl.super__Vector_impl_data._M_start;
          __position_00._M_current = *(anon_struct_120_15_f999644b **)(this_01 + 8);
          if (__position_00._M_current == *(anon_struct_120_15_f999644b **)(this_01 + 0x10)) {
            std::vector<particle_info,std::allocator<particle_info>>::
            _M_realloc_insert<particle_info_const&>
                      (this_01,__position_00,(anon_struct_120_15_f999644b *)&local_a8);
          }
          else {
            paVar5 = (anon_struct_120_15_f999644b *)&local_a8;
            for (lVar7 = 0xf; lVar7 != 0; lVar7 = lVar7 + -1) {
              uVar3 = *(undefined4 *)&paVar5->field_0x4;
              (__position_00._M_current)->monval = paVar5->monval;
              *(undefined4 *)&(__position_00._M_current)->field_0x4 = uVar3;
              paVar5 = (anon_struct_120_15_f999644b *)((long)paVar5 + (ulong)bVar8 * -0x10 + 8);
              __position_00._M_current = __position_00._M_current + (ulong)bVar8 * -0x10 + 8;
            }
            *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 0x78;
          }
          iVar4 = iVar4 + 1;
        } while (iVar4 < local_ec);
      }
      uVar6 = (ulong)(uint)((int)local_e0 + local_ec);
      uVar2 = local_e4;
    }
  } while ((uVar2 & 2) == 0);
  return 0;
}

Assistant:

int particleSamples::read_in_particle_samples_mixed_event_binary() {
    // clean out the previous record
    clear_out_previous_record(full_particle_list_mixed_event);
    int ievent = 0;
    int num_particles = 0;
    while (num_particles < event_buffer_size) {
        int n_particle = 0;
        inputfile_mixed_event.read(
            reinterpret_cast<char *>(&n_particle), sizeof(int));

        if (inputfile_mixed_event.eof()) break;

        // create one event
        full_particle_list_mixed_event->push_back(new vector<particle_info>);

        // std::cout << "Read in " << n_particle << " particles" << std::endl;
        for (int ipart = 0; ipart < n_particle; ipart++) {
            int pdg = 0;
            inputfile_mixed_event.read(
                reinterpret_cast<char *>(&pdg), sizeof(int));
            float array[9];
            for (int i = 0; i < 9; i++) {
                float temp = 0.;
                inputfile_mixed_event.read(
                    reinterpret_cast<char *>(&temp), sizeof(float));
                array[i] = temp;
            }

            particle_info temp_particle_info;
            temp_particle_info.monval = pdg;
            temp_particle_info.mass = array[0];
            temp_particle_info.t = array[1];
            temp_particle_info.x = array[2];
            temp_particle_info.y = array[3];
            temp_particle_info.z = array[4];
            temp_particle_info.E = array[5];
            temp_particle_info.px = array[6];
            temp_particle_info.py = array[7];
            temp_particle_info.pz = array[8];

            (*full_particle_list_mixed_event)[ievent]->push_back(
                temp_particle_info);
        }
        num_particles += n_particle;
    }
    return (0);
}